

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffukyuj(fitsfile *fptr,char *keyname,ULONGLONG value,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    iVar1 = ffmkyuj(fptr,keyname,value,comm,status);
    if (iVar1 == 0xca) {
      *status = iVar2;
      ffpkyuj(fptr,keyname,value,comm,status);
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffukyuj(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           ULONGLONG value,     /* I - keyword value      */
           const char *comm,   /* I - keyword comment    */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkyuj(fptr, keyname, value, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkyuj(fptr, keyname, value, comm, status);
    }
    return(*status);
}